

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flip.cpp
# Opt level: O0

color3 * __thiscall flip_detail::color3::LinearRGB2XYZ(color3 *this)

{
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  color3 v;
  float a33;
  float a32;
  float a31;
  float a23;
  float a22;
  float a21;
  float a13;
  float a12;
  float a11;
  color3 *this_local;
  
  uVar2 = this->x;
  uVar3 = this->y;
  fVar1 = this->z;
  this->x = fVar1 * 0.18045048 + (float)uVar2 * 0.41238657 + (float)uVar3 * 0.35759148;
  this->y = fVar1 * 0.0721802 + (float)uVar2 * 0.21263683 + (float)uVar3 * 0.71518296;
  this->z = fVar1 * 0.9503726 + (float)uVar2 * 0.019330619 + (float)uVar3 * 0.11919716;
  return this;
}

Assistant:

color3& color3::LinearRGB2XYZ()    // Source: https://www.image-engineering.de/library/technotes/958-how-to-convert-between-srgb-and-ciexyz
{                               // Assumes D65 standard illuminant
    const float a11 = 10135552.0f / 24577794.0f;
    const float a12 = 8788810.0f / 24577794.0f;
    const float a13 = 4435075.0f / 24577794.0f;
    const float a21 = 2613072.0f / 12288897.0f;
    const float a22 = 8788810.0f / 12288897.0f;
    const float a23 = 887015.0f / 12288897.0f;
    const float a31 = 1425312.0f / 73733382.0f;
    const float a32 = 8788810.0f / 73733382.0f;
    const float a33 = 70074185.0f / 73733382.0f;
    color3 v = *this;
    x = a11 * v.x + a12 * v.y + a13 * v.z;
    y = a21 * v.x + a22 * v.y + a23 * v.z;
    z = a31 * v.x + a32 * v.y + a33 * v.z;
    return *this;
}